

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
DefaultState<false>::Float(DefaultState<false> *this,Context<false> *ctx,float f)

{
  char *pcVar1;
  Namespace<false> *this_00;
  uint64_t i;
  long in_RSI;
  BaseState<false> *in_RDI;
  Namespace<false> *ns;
  char *in_stack_ffffffffffffff68;
  allocator *u;
  string *in_stack_ffffffffffffffa8;
  vw *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [32];
  Namespace<false> *local_20;
  long local_10;
  
  local_10 = in_RSI;
  this_00 = Context<false>::CurrentNamespace((Context<false> *)0x27921a);
  pcVar1 = *(char **)(local_10 + 0x10);
  u = &local_41;
  local_20 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,u);
  i = VW::hash_feature(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(uint64_t)u);
  Namespace<false>::AddFeature
            (this_00,(feature_value)((ulong)in_RDI >> 0x20),i,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return in_RDI;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float f)
  {
    auto& ns = ctx.CurrentNamespace();
    ns.AddFeature(f, VW::hash_feature(*ctx.all, ctx.key, ns.namespace_hash), ctx.key);

    return this;
  }